

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiViewport * ImGui::FindViewportByPlatformHandle(void *platform_handle)

{
  ImGuiViewportP **ppIVar1;
  int i;
  int i_00;
  ImVector<ImGuiViewportP_*> *this;
  
  this = &GImGui->Viewports;
  i_00 = 0;
  while( true ) {
    if (i_00 == this->Size) {
      return (ImGuiViewport *)0x0;
    }
    ppIVar1 = ImVector<ImGuiViewportP_*>::operator[](this,i_00);
    if (((*ppIVar1)->super_ImGuiViewport).PlatformHandle == platform_handle) break;
    i_00 = i_00 + 1;
  }
  ppIVar1 = ImVector<ImGuiViewportP_*>::operator[](this,i_00);
  return &(*ppIVar1)->super_ImGuiViewport;
}

Assistant:

ImGuiViewport* ImGui::FindViewportByPlatformHandle(void* platform_handle)
{
    ImGuiContext& g = *GImGui;
    for (int i = 0; i != g.Viewports.Size; i++)
        if (g.Viewports[i]->PlatformHandle == platform_handle)
            return g.Viewports[i];
    return NULL;
}